

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Vector3.h
# Opt level: O0

Vector3 * __thiscall Vector3::cross(Vector3 *this,Vector3 *v)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  Vector3 *in_RDX;
  double *in_RSI;
  Vector3 *in_RDI;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  
  dVar1 = in_RSI[1];
  dVar7 = getZ(in_RDX);
  dVar2 = in_RSI[2];
  dVar8 = getY(in_RDX);
  dVar3 = in_RSI[2];
  dVar9 = getX(in_RDX);
  dVar4 = *in_RSI;
  dVar10 = getZ(in_RDX);
  dVar5 = *in_RSI;
  dVar11 = getY(in_RDX);
  dVar6 = in_RSI[1];
  dVar12 = getX(in_RDX);
  Vector3(in_RDI,dVar1 * dVar7 + -(dVar2 * dVar8),dVar3 * dVar9 + -(dVar4 * dVar10),
          dVar5 * dVar11 + -(dVar6 * dVar12));
  return in_RDI;
}

Assistant:

inline Vector3 Vector3::cross(const Vector3 &v) const {
    return {y * v.getZ() - z * v.getY(),
            z * v.getX() - x * v.getZ(),
            x * v.getY() - y * v.getX()};
}